

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestEagerMaybeLazy::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *pMVar3;
  char *failure_msg;
  void *pvVar4;
  int line;
  Arena *arena;
  TestEagerMaybeLazy *_this;
  TestEagerMaybeLazy *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestEagerMaybeLazy *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<edition_unittest::TestEagerMaybeLazy_const*,edition_unittest::TestEagerMaybeLazy*>
                          ((TestEagerMaybeLazy **)local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 7) != 0) {
      if ((uVar1 & 1) != 0) {
        pMVar2 = (MessageLite *)from_msg[1]._internal_metadata_.ptr_;
        if (pMVar2 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.message_foo_ != nullptr";
          line = 0x6577;
          goto LAB_009c0bae;
        }
        pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 8);
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar4 = google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                             (arena,pMVar2);
          *(void **)((long)&local_30->field_0 + 8) = pvVar4;
        }
        else {
          edition_unittest::TestAllTypes::MergeImpl(pMVar3,pMVar2);
        }
      }
      if ((uVar1 & 2) != 0) {
        pMVar2 = (MessageLite *)from_msg[2]._vptr_MessageLite;
        if (pMVar2 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.message_bar_ != nullptr";
          line = 0x657f;
          goto LAB_009c0bae;
        }
        pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 0x10);
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar4 = google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                             (arena,pMVar2);
          *(void **)((long)&local_30->field_0 + 0x10) = pvVar4;
        }
        else {
          edition_unittest::TestAllTypes::MergeImpl(pMVar3,pMVar2);
        }
      }
      if ((uVar1 & 4) != 0) {
        pMVar2 = (MessageLite *)from_msg[2]._internal_metadata_.ptr_;
        if (pMVar2 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.message_baz_ != nullptr";
          line = 0x6587;
          goto LAB_009c0bae;
        }
        pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 0x18);
        if (pMVar3 == (MessageLite *)0x0) {
          pvVar4 = google::protobuf::Arena::
                   CopyConstruct<edition_unittest::TestEagerMaybeLazy_NestedMessage>(arena,pMVar2);
          *(void **)((long)&local_30->field_0 + 0x18) = pvVar4;
        }
        else {
          TestEagerMaybeLazy_NestedMessage::MergeImpl(pMVar3,pMVar2);
        }
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x6570;
LAB_009c0bae:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void TestEagerMaybeLazy::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestEagerMaybeLazy*>(&to_msg);
  auto& from = static_cast<const TestEagerMaybeLazy&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestEagerMaybeLazy)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.message_foo_ != nullptr);
      if (_this->_impl_.message_foo_ == nullptr) {
        _this->_impl_.message_foo_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.message_foo_);
      } else {
        _this->_impl_.message_foo_->MergeFrom(*from._impl_.message_foo_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.message_bar_ != nullptr);
      if (_this->_impl_.message_bar_ == nullptr) {
        _this->_impl_.message_bar_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.message_bar_);
      } else {
        _this->_impl_.message_bar_->MergeFrom(*from._impl_.message_bar_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.message_baz_ != nullptr);
      if (_this->_impl_.message_baz_ == nullptr) {
        _this->_impl_.message_baz_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.message_baz_);
      } else {
        _this->_impl_.message_baz_->MergeFrom(*from._impl_.message_baz_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}